

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O2

void __thiscall pbrt::ComputeBeamDiffusionBSSRDF(pbrt *this,Float g,Float eta,BSSRDFTable *t)

{
  undefined8 *puVar1;
  ulong uVar2;
  long end;
  undefined1 auVar3 [16];
  long *plVar4;
  int i;
  ulong uVar5;
  int i_1;
  long lVar6;
  int iVar7;
  float fVar8;
  undefined4 in_XMM2_Da;
  undefined1 in_register_00001284 [12];
  Float eta_local;
  Float g_local;
  BSSRDFTable *t_local;
  function<void_(long)> local_48;
  
  puVar1 = *(undefined8 **)(this + 0x28);
  *puVar1 = 0x3b23d70a00000000;
  uVar2 = *(ulong *)(this + 0x38);
  for (uVar5 = 2; uVar5 < uVar2; uVar5 = uVar5 + 1) {
    *(float *)((long)puVar1 + uVar5 * 4) = *(float *)((long)puVar1 + uVar5 * 4 + -4) * 1.2;
  }
  end = *(long *)(this + 0x18);
  iVar7 = 0;
  lVar6 = 0;
  auVar3._4_12_ = in_register_00001284;
  auVar3._0_4_ = in_XMM2_Da;
  auVar3 = vcvtusi2ss_avx512f(auVar3,end + -1);
  eta_local = eta;
  g_local = g;
  t_local = (BSSRDFTable *)this;
  for (; end != lVar6; lVar6 = lVar6 + 1) {
    fVar8 = expf((float)iVar7 / auVar3._0_4_);
    iVar7 = iVar7 + -8;
    *(float *)(*(long *)(this + 8) + lVar6 * 4) = (1.0 - fVar8) / 0.99966455;
  }
  local_48 = (function<void_(long)>)(ZEXT1232(ZEXT812(0)) << 0x20);
  plVar4 = (long *)operator_new(0x18);
  *plVar4 = (long)&t_local;
  plVar4[1] = (long)&g_local;
  plVar4[2] = (long)&eta_local;
  local_48.super__Function_base._M_functor._M_unused._M_object = plVar4;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bssrdf.cpp:112:42)>
       ::_M_manager;
  local_48._M_invoker =
       std::
       _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bssrdf.cpp:112:42)>
       ::_M_invoke;
  ParallelFor(0,end,&local_48);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  return;
}

Assistant:

void ComputeBeamDiffusionBSSRDF(Float g, Float eta, BSSRDFTable *t) {
    // Choose radius values of the diffusion profile discretization
    t->radiusSamples[0] = 0;
    t->radiusSamples[1] = 2.5e-3f;
    for (int i = 2; i < t->radiusSamples.size(); ++i)
        t->radiusSamples[i] = t->radiusSamples[i - 1] * 1.2f;

    // Choose albedo values of the diffusion profile discretization
    for (int i = 0; i < t->rhoSamples.size(); ++i)
        t->rhoSamples[i] = (1 - std::exp(-8 * i / (Float)(t->rhoSamples.size() - 1))) /
                           (1 - std::exp(-8));

    ParallelFor(0, t->rhoSamples.size(), [&](int i) {
        // Compute the diffusion profile for the _i_th albedo sample
        // Compute scattering profile for chosen albedo $\rho$
        size_t nSamples = t->radiusSamples.size();
        for (int j = 0; j < nSamples; ++j) {
            Float rho = t->rhoSamples[i], r = t->radiusSamples[j];
            t->profile[i * nSamples + j] = 2 * Pi * r *
                                           (BeamDiffusionSS(rho, 1 - rho, g, eta, r) +
                                            BeamDiffusionMS(rho, 1 - rho, g, eta, r));
        }

        // Compute effective albedo $\rho_{\roman{eff}}$ and CDF for importance sampling
        t->rhoEff[i] =
            IntegrateCatmullRom(t->radiusSamples, {&t->profile[i * nSamples], nSamples},
                                {&t->profileCDF[i * nSamples], nSamples});
    });
}